

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fast_float.h
# Opt level: O1

from_chars_result
duckdb_fast_float::from_chars<double>
          (char *first,char *last,double *value,bool strict,char decimal_separator,chars_format fmt)

{
  char cVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  from_chars_result fVar11;
  from_chars_result fVar12;
  from_chars_result fVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  uint uVar16;
  double *pdVar17;
  byte bVar18;
  ulong uVar19;
  byte *pbVar20;
  byte *pbVar21;
  undefined7 uVar23;
  ulong uVar22;
  undefined8 unaff_RBP;
  double *pdVar24;
  double *pdVar25;
  int iVar26;
  ulong uVar27;
  double dVar28;
  char cVar29;
  uint uVar30;
  byte *pbVar31;
  int iVar32;
  ulong in_R10;
  ulong uVar33;
  long lVar34;
  ulong uVar35;
  long lVar36;
  double *pdVar37;
  long lVar38;
  bool bVar39;
  bool bVar40;
  double dVar41;
  undefined1 auVar42 [16];
  from_chars_result fVar43;
  adjusted_mantissa aVar44;
  double *local_40;
  
  if (first == last) {
    fVar43._8_8_ = 0x16;
    fVar43.ptr = first;
    return fVar43;
  }
  cVar1 = *first;
  pdVar24 = (double *)CONCAT71((int7)((ulong)unaff_RBP >> 8),cVar1);
  pdVar17 = (double *)first;
  if (cVar1 == '-') {
    pdVar17 = (double *)(first + 1);
    pdVar37 = value;
    if (pdVar17 != (double *)last) {
      bVar18 = *(byte *)pdVar17;
      uVar23 = (undefined7)((ulong)value >> 8);
      iVar32 = (int)CONCAT71(uVar23,bVar18) + -0x30;
      bVar39 = 9 < (byte)iVar32;
      in_R10 = (ulong)CONCAT31((int3)((uint)iVar32 >> 8),bVar39);
      pdVar37 = (double *)CONCAT71(uVar23,bVar18 != decimal_separator);
      if (bVar18 == decimal_separator || !bVar39) goto LAB_01286470;
    }
  }
  else {
LAB_01286470:
    bVar18 = *(byte *)pdVar17;
    in_R10 = 0;
    pdVar25 = pdVar17;
    if ((byte)(bVar18 - 0x30) < 10) {
      do {
        local_40 = (double *)((long)pdVar25 + 1);
        pdVar37 = local_40;
        if (((local_40 != (double *)last) && (*(byte *)local_40 == 0x5f)) &&
           ((strict ||
            ((pdVar37 = (double *)((long)pdVar25 + 2), pdVar37 == (double *)last ||
             (local_40 = pdVar37, 9 < (byte)(*(byte *)pdVar37 - 0x30))))))) {
          bVar40 = false;
          bVar39 = false;
          goto LAB_012868c9;
        }
        in_R10 = ((ulong)bVar18 + in_R10 * 10) - 0x30;
        bVar39 = pdVar37 == (double *)last;
      } while ((!bVar39) &&
              (bVar18 = *(byte *)pdVar37, pdVar25 = pdVar37, (byte)(bVar18 - 0x30) < 10));
    }
    else {
      bVar39 = false;
      pdVar37 = pdVar17;
    }
    lVar34 = (long)pdVar37 - (long)pdVar17;
    if ((bVar39) || (*(byte *)pdVar37 != decimal_separator)) {
      local_40 = (double *)0x0;
      pdVar24 = pdVar37;
    }
    else {
      local_40 = (double *)((long)pdVar37 + 1);
      pdVar25 = (double *)((long)pdVar37 + 9);
      pdVar24 = local_40;
      if ((pdVar25 <= last) &&
         (uVar35 = (long)*local_40 + 0xcfcfcfcfcfcfcfd0,
         (((long)*local_40 + 0x4646464646464646U | uVar35) & 0x8080808080808080) == 0)) {
        uVar35 = (uVar35 >> 8) + uVar35 * 10;
        in_R10 = ((uVar35 >> 0x10 & 0xff000000ff) * 0x271000000001 +
                  (uVar35 & 0xff000000ff) * 0xf424000000064 >> 0x20) + in_R10 * 100000000;
        pdVar24 = pdVar25;
        if (((double *)((long)pdVar37 + 0x11U) <= last) &&
           (uVar35 = (long)*pdVar25 + 0xcfcfcfcfcfcfcfd0,
           (((long)*pdVar25 + 0x4646464646464646U | uVar35) & 0x8080808080808080) == 0)) {
          uVar35 = (uVar35 >> 8) + uVar35 * 10;
          in_R10 = ((uVar35 >> 0x10 & 0xff000000ff) * 0x271000000001 +
                    (uVar35 & 0xff000000ff) * 0xf424000000064 >> 0x20) + in_R10 * 100000000;
          pdVar24 = (double *)((long)pdVar37 + 0x11U);
        }
      }
      lVar38 = 0;
      do {
        if ((pdVar24 == (double *)last) || (9 < (byte)(*(byte *)pdVar24 - 0x30))) {
          local_40 = (double *)((long)local_40 + (lVar38 - (long)pdVar24));
          lVar34 = lVar34 - (long)local_40;
          bVar39 = true;
          goto LAB_01286666;
        }
        pdVar25 = (double *)((long)pdVar24 + 1);
        if (pdVar25 == (double *)last) {
          bVar39 = true;
        }
        else {
          bVar39 = *(byte *)pdVar25 != 0x5f;
          if (!bVar39 && !strict) {
            pdVar25 = (double *)((long)pdVar24 + 2);
            lVar38 = lVar38 + 1;
            if (pdVar25 == (double *)last) {
              bVar39 = false;
            }
            else {
              bVar39 = (byte)(*(byte *)pdVar25 - 0x30) < 10;
            }
          }
        }
        in_R10 = (ulong)(byte)(*(byte *)pdVar24 - 0x30) + in_R10 * 10;
        pdVar24 = pdVar25;
      } while (bVar39);
      local_40 = (double *)0x0;
      bVar39 = false;
LAB_01286666:
      if (!bVar39) goto LAB_012868c6;
    }
    if (lVar34 != 0) {
      if ((((fmt & scientific) == 0) || (pdVar24 == (double *)last)) ||
         ((*(byte *)pdVar24 | 0x20) != 0x65)) {
        if ((fmt & general) == scientific) goto LAB_012868c6;
        lVar38 = 0;
      }
      else {
        pdVar25 = (double *)((long)pdVar24 + 1);
        if (pdVar25 == (double *)last) {
LAB_01286685:
          bVar39 = false;
        }
        else {
          if (*(byte *)pdVar25 != 0x2d) {
            if (*(byte *)pdVar25 == 0x2b) {
              pdVar25 = (double *)((long)pdVar24 + 2);
            }
            goto LAB_01286685;
          }
          pdVar25 = (double *)((long)pdVar24 + 2);
          bVar39 = true;
        }
        if ((pdVar25 == (double *)last) || (9 < (byte)(*(byte *)pdVar25 - 0x30))) {
          uVar30 = fmt >> 2 & 1;
          cVar29 = (char)uVar30;
          if (uVar30 == 0) {
            pdVar24 = pdVar25;
          }
          lVar38 = 0;
        }
        else {
          lVar36 = 0;
          pdVar24 = pdVar25;
          do {
            if ((pdVar24 == (double *)last) || (9 < (byte)(*(byte *)pdVar24 - 0x30))) {
              lVar38 = -lVar36;
              if (!bVar39) {
                lVar38 = lVar36;
              }
              local_40 = (double *)((long)local_40 + lVar38);
              cVar29 = '\x01';
              goto LAB_012867f0;
            }
            lVar38 = (ulong)(byte)(*(byte *)pdVar24 - 0x30) + lVar36 * 10;
            if (0xffff < lVar36) {
              lVar38 = lVar36;
            }
            pdVar25 = (double *)((long)pdVar24 + 1);
            if (pdVar25 == (double *)last) {
              bVar40 = true;
            }
            else {
              bVar40 = *(byte *)pdVar25 != 0x5f;
              if (!bVar40 && !strict) {
                pdVar25 = (double *)((long)pdVar24 + 2);
                if (pdVar25 == (double *)last) {
                  bVar40 = false;
                }
                else {
                  bVar40 = (byte)(*(byte *)pdVar25 - 0x30) < 10;
                }
              }
            }
            pdVar24 = pdVar25;
            lVar36 = lVar38;
          } while (bVar40);
          cVar29 = '\0';
        }
LAB_012867f0:
        if (cVar29 == '\0') goto LAB_012868c6;
      }
      bVar39 = true;
      pdVar25 = pdVar17;
      if (0x13 < lVar34) {
        do {
          bVar18 = *(byte *)pdVar25;
          if (bVar18 != 0x30 && bVar18 != decimal_separator) break;
          lVar34 = lVar34 - (ulong)(bVar18 == 0x30);
          pdVar25 = (double *)((long)pdVar25 + 1);
        } while (pdVar25 != (double *)last);
        if (0x13 < lVar34) {
          in_R10 = 0;
          while ((byte)(*(byte *)pdVar17 - 0x30) < 10) {
            in_R10 = ((ulong)*(byte *)pdVar17 + in_R10 * 10) - 0x30;
            pdVar25 = (double *)((long)pdVar17 + 1);
            if (((pdVar25 != (double *)last) && (*(byte *)pdVar25 == 0x5f)) &&
               ((strict ||
                ((pdVar25 = (double *)((long)pdVar17 + 2), pdVar25 == (double *)last ||
                 (9 < (byte)(*(byte *)pdVar25 - 0x30))))))) goto LAB_01286ce2;
            pdVar17 = pdVar25;
            if ((999999999999999999 < in_R10) || (pdVar17 == (double *)last)) break;
          }
          if (in_R10 < 1000000000000000000) {
            pbVar31 = (byte *)((long)pdVar17 + 1);
            lVar34 = 0;
            pbVar21 = pbVar31;
            pbVar20 = pbVar31;
            if (pbVar31 != (byte *)last) {
              while (pbVar21 = pbVar20, (byte)(*pbVar20 - 0x30) < 10) {
                in_R10 = ((ulong)*pbVar20 + in_R10 * 10) - 0x30;
                pbVar21 = pbVar20 + 1;
                if ((pbVar21 != (byte *)last) && (*pbVar21 == 0x5f)) {
                  pbVar21 = pbVar20 + 2;
                  if ((pbVar21 == (byte *)last) || (9 < (byte)(*pbVar21 - 0x30))) goto LAB_01286ce2;
                  lVar34 = lVar34 + 1;
                }
                if ((999999999999999999 < in_R10) || (pbVar20 = pbVar21, pbVar21 == (byte *)last))
                break;
              }
            }
            local_40 = (double *)(pbVar31 + lVar34 + (lVar38 - (long)pbVar21));
          }
          else {
            local_40 = (double *)((long)pdVar37 + (lVar38 - (long)pdVar17));
          }
          bVar40 = true;
          bVar39 = true;
          goto LAB_012868c9;
        }
      }
      bVar40 = false;
      goto LAB_012868c9;
    }
  }
LAB_012868c6:
  local_40 = pdVar37;
  bVar40 = false;
  bVar39 = false;
LAB_012868c9:
  if (!bVar39) {
    fVar43 = detail::parse_infnan<double>(first,last,value);
    return fVar43;
  }
  if ((in_R10 < 0x20000000000001 && !bVar40) &&
      (byte *)0xffffffffffffffd2 < (byte *)((long)local_40 - 0x17U)) {
    auVar42._8_4_ = (int)(in_R10 >> 0x20);
    auVar42._0_8_ = in_R10;
    auVar42._12_4_ = 0x45300000;
    dVar41 = (auVar42._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)in_R10) - 4503599627370496.0);
    *value = dVar41;
    if ((long)local_40 < 0) {
      dVar41 = dVar41 / *(double *)(powers_of_ten_double + (long)local_40 * -8);
    }
    else {
      dVar41 = dVar41 * *(double *)(powers_of_ten_double + (long)local_40 * 8);
    }
    fVar13._8_8_ = 0;
    fVar13.ptr = (char *)pdVar24;
    fVar12._8_8_ = 0;
    fVar12.ptr = (char *)pdVar24;
    *value = dVar41;
    if (cVar1 != '-') {
      return fVar12;
    }
    *value = -dVar41;
    return fVar13;
  }
  uVar35 = 0;
  iVar32 = (int)local_40;
  if (in_R10 == 0) {
LAB_01286922:
    uVar27 = 0;
  }
  else {
    uVar27 = 0;
    if (-0x157 < (long)local_40) {
      if (0x134 < (long)local_40) {
        uVar35 = 0x7ff;
        goto LAB_01286922;
      }
      uVar35 = 0x3f;
      if (in_R10 != 0) {
        for (; in_R10 >> uVar35 == 0; uVar35 = uVar35 - 1) {
        }
      }
      uVar27 = in_R10 << ((byte)(uVar35 ^ 0x3f) & 0x3f);
      auVar2._8_8_ = 0;
      auVar2._0_8_ = uVar27;
      auVar6._8_8_ = 0;
      auVar6._0_8_ = *(ulong *)(powers_template<void>::power_of_five_128 +
                               (long)(iVar32 * 2 + 0x2ac) * 8);
      auVar2 = auVar2 * auVar6;
      if ((~auVar2._8_4_ & 0x1ff) == 0) {
        auVar3._8_8_ = 0;
        auVar3._0_8_ = uVar27;
        auVar7._8_8_ = 0;
        auVar7._0_8_ = *(ulong *)(powers_template<void>::power_of_five_128 +
                                 (long)(iVar32 * 2 + 0x2ad) * 8);
        auVar14._8_8_ = 0;
        auVar14._0_8_ = SUB168(auVar3 * auVar7,8);
        auVar2 = auVar2 + auVar14;
      }
      if (((byte *)((long)local_40 + 0x1bU) < (byte *)0x53) || (auVar2._0_8_ != 0xffffffffffffffff))
      {
        iVar26 = (((iVar32 * 0x3526a >> 0x10) - (int)(uVar35 ^ 0x3f)) - (auVar2._12_4_ >> 0x1f)) +
                 0x43e;
        bVar18 = 9 - (auVar2[0xf] >> 7);
        uVar35 = auVar2._8_8_ >> (bVar18 & 0x3f);
        if (iVar26 < 1) {
          if (iVar26 < -0x3e) {
            uVar35 = 0;
            uVar27 = 0;
          }
          else {
            bVar18 = 1 - (char)iVar26;
            uVar27 = (uVar35 >> (bVar18 & 0x3f)) +
                     (ulong)((uVar35 >> ((ulong)bVar18 & 0x3f) & 1) != 0);
            uVar35 = (ulong)(0x1fffffffffffff < uVar27);
            uVar27 = uVar27 >> 1;
          }
        }
        else {
          uVar27 = uVar35 & 0xfffffffffffffe;
          if (uVar35 << (bVar18 & 0x3f) != auVar2._8_8_ || ((uint)uVar35 & 3) != 1) {
            uVar27 = uVar35;
          }
          if ((byte *)0x1b < (byte *)((long)local_40 + 4U)) {
            uVar27 = uVar35;
          }
          if (1 < auVar2._0_8_) {
            uVar27 = uVar35;
          }
          uVar35 = (ulong)((uint)uVar27 & 1);
          bVar39 = uVar35 + uVar27 >> 0x36 != 0;
          uVar27 = (uVar27 >> 1) + (uVar35 & uVar27) & 0x7fefffffffffffff;
          if (bVar39) {
            uVar27 = 0;
          }
          uVar16 = iVar26 + (uint)bVar39;
          uVar30 = uVar16;
          if (0x7fe < (int)uVar16) {
            uVar30 = 0x7ff;
          }
          uVar35 = (ulong)uVar30;
          if (0x7fe < (int)uVar16) {
            uVar27 = 0;
          }
        }
      }
      else {
        uVar35 = 0xffffffff;
        uVar27 = 0;
      }
    }
  }
  if (!bVar40) goto LAB_01286dbe;
  uVar16 = 0;
  uVar33 = in_R10 + 1;
  uVar30 = 0;
  if (uVar33 == 0) {
LAB_01286959:
    uVar16 = uVar30;
    uVar19 = 0;
  }
  else {
    uVar19 = 0;
    if (-0x157 < (long)local_40) {
      if (0x134 < (long)local_40) {
        uVar30 = 0x7ff;
        goto LAB_01286959;
      }
      uVar19 = 0x3f;
      if (uVar33 != 0) {
        for (; uVar33 >> uVar19 == 0; uVar19 = uVar19 - 1) {
        }
      }
      uVar33 = uVar33 << ((byte)(uVar19 ^ 0x3f) & 0x3f);
      auVar4._8_8_ = 0;
      auVar4._0_8_ = uVar33;
      auVar8._8_8_ = 0;
      auVar8._0_8_ = *(ulong *)(powers_template<void>::power_of_five_128 +
                               (long)(iVar32 * 2 + 0x2ac) * 8);
      auVar10 = auVar4 * auVar8;
      uVar22 = auVar10._8_8_;
      if ((~auVar10._8_4_ & 0x1ff) == 0) {
        auVar5._8_8_ = 0;
        auVar5._0_8_ = uVar33;
        auVar9._8_8_ = 0;
        auVar9._0_8_ = *(ulong *)(powers_template<void>::power_of_five_128 +
                                 (long)(iVar32 * 2 + 0x2ad) * 8);
        uVar33 = SUB168(auVar5 * auVar9,8);
        auVar15._8_8_ = 0;
        auVar15._0_8_ = uVar33;
        auVar15 = auVar10 + auVar15;
        auVar10._8_8_ = uVar33;
        auVar10._0_8_ = auVar15._0_8_;
        uVar22 = auVar15._8_8_;
      }
      if (((byte *)((long)local_40 + 0x1bU) < (byte *)0x53) || (auVar10._0_8_ != 0xffffffffffffffff)
         ) {
        iVar32 = (((iVar32 * 0x3526a >> 0x10) - (int)(uVar19 ^ 0x3f)) - (int)((long)uVar22 >> 0x3f))
                 + 0x43e;
        bVar18 = 9 - (char)((long)uVar22 >> 0x3f);
        uVar33 = uVar22 >> (bVar18 & 0x3f);
        if (iVar32 < 1) {
          if (iVar32 < -0x3e) {
            uVar16 = 0;
            uVar19 = 0;
          }
          else {
            bVar18 = 1 - (char)iVar32;
            uVar33 = (uVar33 >> (bVar18 & 0x3f)) +
                     (ulong)((uVar33 >> ((ulong)bVar18 & 0x3f) & 1) != 0);
            uVar16 = (uint)(0x1fffffffffffff < uVar33);
            uVar19 = uVar33 >> 1;
          }
        }
        else {
          uVar19 = uVar33 & 0xfffffffffffffe;
          if (uVar33 << (bVar18 & 0x3f) != uVar22 || ((uint)uVar33 & 3) != 1) {
            uVar19 = uVar33;
          }
          if ((byte *)0x1b < (byte *)((long)local_40 + 4U)) {
            uVar19 = uVar33;
          }
          if (1 < auVar10._0_8_) {
            uVar19 = uVar33;
          }
          uVar33 = (ulong)((uint)uVar19 & 1);
          bVar39 = uVar33 + uVar19 >> 0x36 != 0;
          uVar19 = (uVar19 >> 1) + (uVar33 & uVar19) & 0x7fefffffffffffff;
          if (bVar39) {
            uVar19 = 0;
          }
          uVar16 = iVar32 + (uint)bVar39;
          if (0x7fe < (int)uVar16) {
            uVar16 = 0x7ff;
            uVar19 = 0;
          }
        }
      }
      else {
        uVar16 = 0xffffffff;
        uVar19 = 0;
      }
    }
  }
  if ((uint)uVar35 != uVar16) {
    uVar35 = 0xffffffff;
  }
  if (uVar27 != uVar19) {
    uVar35 = 0xffffffff;
  }
LAB_01286dbe:
  if ((int)uVar35 < 0) {
    aVar44 = parse_long_mantissa<duckdb_fast_float::binary_format<double>>(first,last);
    uVar27 = aVar44.mantissa;
    uVar35 = (ulong)(uint)aVar44.power2;
  }
  dVar28 = (double)(uVar35 << 0x34 | uVar27);
  dVar41 = (double)((ulong)dVar28 | 0x8000000000000000);
  if (cVar1 != '-') {
    dVar41 = dVar28;
  }
  *value = dVar41;
  fVar11._8_8_ = 0;
  fVar11.ptr = (char *)pdVar24;
  return fVar11;
LAB_01286ce2:
  bVar40 = true;
  bVar39 = false;
  goto LAB_012868c9;
}

Assistant:

from_chars_result from_chars(const char *first, const char *last,
                             T &value, bool strict, const char decimal_separator, chars_format fmt
                              /*= chars_format::general*/)  noexcept  {
  static_assert (std::is_same<T, double>::value || std::is_same<T, float>::value, "only float and double are supported");


  from_chars_result answer;
  if (first == last) {
    answer.ec = std::errc::invalid_argument;
    answer.ptr = first;
    return answer;
  }
  parsed_number_string pns = parse_number_string(first, last, decimal_separator, fmt, strict);
  if (!pns.valid) {
    return detail::parse_infnan(first, last, value);
  }
  answer.ec = std::errc(); // be optimistic
  answer.ptr = pns.lastmatch;
  // Next is Clinger's fast path.
  if (binary_format<T>::min_exponent_fast_path() <= pns.exponent && pns.exponent <= binary_format<T>::max_exponent_fast_path() && pns.mantissa <=binary_format<T>::max_mantissa_fast_path() && !pns.too_many_digits) {
    value = T(pns.mantissa);
    if (pns.exponent < 0) { value = value / binary_format<T>::exact_power_of_ten(-pns.exponent); }
    else { value = value * binary_format<T>::exact_power_of_ten(pns.exponent); }
    if (pns.negative) { value = -value; }
    return answer;
  }
  adjusted_mantissa am = compute_float<binary_format<T>>(pns.exponent, pns.mantissa);
  if(pns.too_many_digits) {
    if(am != compute_float<binary_format<T>>(pns.exponent, pns.mantissa + 1)) {
      am.power2 = -1; // value is invalid.
    }
  }
  // If we called compute_float<binary_format<T>>(pns.exponent, pns.mantissa) and we have an invalid power (am.power2 < 0),
  // then we need to go the long way around again. This is very uncommon.
  if(am.power2 < 0) { am = parse_long_mantissa<binary_format<T>>(first,last); }
  detail::to_float(pns.negative, am, value);
  return answer;
}